

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<long,_4UL,_0UL,_std::allocator<long>_>::small_vector
          (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this,
          small_vector<long,_4UL,_0UL,_std::allocator<long>_> *v)

{
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *psVar1;
  long *plVar2;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RSI;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *in_RDI;
  pointer p;
  allocator<long> *in_stack_ffffffffffffffe0;
  small_vector<long,_4UL,_0UL,_std::allocator<long>_> *this_00;
  pointer local_18;
  
  get_alloc(in_RSI);
  std::allocator<long>::allocator(in_stack_ffffffffffffffe0,(allocator<long> *)in_RDI);
  in_RDI->m_capacity = in_RSI->m_capacity;
  in_RDI->m_dynamic_capacity = in_RSI->m_dynamic_capacity;
  in_RDI->m_dynamic_data = in_RSI->m_dynamic_data;
  this_00 = (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *)in_RSI->m_begin;
  psVar1 = (small_vector<long,_4UL,_0UL,_std::allocator<long>_> *)static_begin_ptr(in_RSI);
  if (this_00 == psVar1) {
    plVar2 = static_begin_ptr(in_RDI);
    in_RDI->m_end = plVar2;
    in_RDI->m_begin = plVar2;
    for (local_18 = in_RSI->m_begin; local_18 != in_RSI->m_end; local_18 = local_18 + 1) {
      get_alloc(in_RDI);
      std::allocator_traits<std::allocator<long>>::construct<long,long>
                ((allocator_type *)this_00,(long *)in_RDI,(long *)0x186e95);
      in_RDI->m_end = in_RDI->m_end + 1;
    }
    clear(this_00);
  }
  else {
    in_RDI->m_begin = in_RSI->m_begin;
    in_RDI->m_end = in_RSI->m_end;
  }
  in_RSI->m_dynamic_capacity = 0;
  in_RSI->m_dynamic_data = (pointer)0x0;
  plVar2 = static_begin_ptr(in_RSI);
  in_RSI->m_end = plVar2;
  in_RSI->m_begin = plVar2;
  in_RSI->m_capacity = 4;
  return;
}

Assistant:

small_vector(small_vector&& v) noexcept
        : m_alloc(std::move(v.get_alloc()))
        , m_capacity(v.m_capacity)
        , m_dynamic_capacity(v.m_dynamic_capacity)
        , m_dynamic_data(v.m_dynamic_data)
    {
        if (v.m_begin == v.static_begin_ptr())
        {
            m_begin = m_end = static_begin_ptr();
            for (auto p = v.m_begin; p != v.m_end; ++p)
            {
                atraits::construct(get_alloc(), m_end, std::move(*p));
                ++m_end;
            }

            v.clear();
        }
        else
        {
            m_begin = v.m_begin;
            m_end = v.m_end;
        }

        v.m_dynamic_capacity = 0;
        v.m_dynamic_data = nullptr;
        v.m_begin = v.m_end = v.static_begin_ptr();
        v.m_capacity = StaticCapacity;
    }